

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void functionDestroy(sqlite3 *db,FuncDef *p)

{
  sqlite3 *in_RSI;
  FuncDestructor *pDestructor;
  int *p_00;
  
  p_00 = *(int **)&in_RSI->openFlags;
  if ((p_00 != (int *)0x0) && (*p_00 = *p_00 + -1, *p_00 == 0)) {
    (**(code **)(p_00 + 2))(*(undefined8 *)(p_00 + 4));
    sqlite3DbFree(in_RSI,p_00);
  }
  return;
}

Assistant:

static void functionDestroy(sqlite3 *db, FuncDef *p){
  FuncDestructor *pDestructor = p->pDestructor;
  if( pDestructor ){
    pDestructor->nRef--;
    if( pDestructor->nRef==0 ){
      pDestructor->xDestroy(pDestructor->pUserData);
      sqlite3DbFree(db, pDestructor);
    }
  }
}